

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::MemberSyntax*>::emplace_back<slang::syntax::MemberSyntax*>
          (SmallVectorBase<slang::syntax::MemberSyntax*> *this,MemberSyntax **args)

{
  long lVar1;
  reference ppMVar2;
  pointer ppMVar3;
  
  lVar1 = *(long *)(this + 8);
  ppMVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppMVar3 = emplaceRealloc<slang::syntax::MemberSyntax*>(this,ppMVar3,args);
    return ppMVar3;
  }
  *ppMVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppMVar2 = SmallVectorBase<slang::syntax::MemberSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
  return ppMVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }